

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_execute(lua_State *L)

{
  double dVar1;
  byte bVar2;
  GCObject *pGVar3;
  lu_mem lVar4;
  CallInfo *pCVar5;
  StkId pTVar6;
  StkId pTVar7;
  Proto *p_00;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Value *pVVar12;
  StkId pTVar13;
  TValue *pTVar14;
  GCObject *pGVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  TValue *local_538;
  TValue *local_528;
  TValue *local_518;
  TValue *local_508;
  bool local_4f1;
  TValue *local_4f0;
  TValue *local_4e8;
  StkId local_4e0;
  bool local_4d2;
  bool local_4d1;
  TValue *local_4d0;
  TValue *local_4c8;
  TValue *local_4b8;
  TValue *local_4b0;
  TValue *local_4a8;
  TValue *local_4a0;
  TValue *local_498;
  TValue *local_490;
  TValue *local_488;
  TValue *local_480;
  TValue *local_478;
  TValue *local_470;
  TValue *local_468;
  StkId local_438;
  TValue *local_428;
  StkId local_410;
  TValue *local_400;
  TValue *local_3e8;
  TValue *local_3d0;
  TValue *io1_13;
  TValue *io2_13;
  int local_398;
  int n_1;
  int j;
  int b_8;
  TValue *io_13;
  Closure *ncl;
  Proto *p;
  TValue *val;
  Table *h;
  uint local_360;
  int last;
  int c_2;
  int n;
  TValue *io1_12;
  TValue *io2_12;
  TValue *io1_11;
  TValue *io2_11;
  TValue *io1_10;
  TValue *io2_10;
  TValue *io1_9;
  TValue *io2_9;
  StkId cb;
  TValue *io_12;
  TValue *pstep;
  TValue *plimit;
  TValue *init;
  TValue *io_11;
  TValue *io_10;
  lua_Number limit;
  lua_Number idx;
  lua_Number step;
  int b_7;
  TValue *io1_8;
  TValue *io2_8;
  int aux;
  StkId lim;
  StkId ofunc;
  StkId nfunc;
  CallInfo *oci;
  CallInfo *nci;
  int b_6;
  int nresults;
  int b_5;
  int a_6;
  TValue *io1_7;
  TValue *io2_7;
  TValue *rb_13;
  int a_5;
  int a_4;
  int a_3;
  int a_2;
  TValue *rc_6;
  TValue *rb_12;
  int a_1;
  TValue *io1_6;
  TValue *io2_6;
  StkId rb_11;
  int c_1;
  int b_4;
  TValue *io_9;
  int res;
  TValue *rb_10;
  TValue *io_8;
  lua_Number nb_6;
  TValue *rb_9;
  TValue *io_7;
  lua_Number nc_5;
  lua_Number nb_5;
  TValue *rc_5;
  TValue *rb_8;
  TValue *io_6;
  lua_Number nc_4;
  lua_Number nb_4;
  TValue *rc_4;
  TValue *rb_7;
  TValue *io_5;
  lua_Number nc_3;
  lua_Number nb_3;
  TValue *rc_3;
  TValue *rb_6;
  TValue *io_4;
  lua_Number nc_2;
  lua_Number nb_2;
  TValue *rc_2;
  TValue *rb_5;
  TValue *io_3;
  lua_Number nc_1;
  lua_Number nb_1;
  TValue *rc_1;
  TValue *rb_4;
  TValue *io_2;
  lua_Number nc;
  lua_Number nb;
  TValue *rc;
  TValue *rb_3;
  TValue *io1_5;
  TValue *io2_5;
  StkId rb_2;
  TValue *io_1;
  Table *t;
  int c;
  int b_3;
  TValue *io1_4;
  TValue *io2_4;
  UpVal *uv;
  int a;
  int b_2;
  TValue *io1_3;
  TValue *io2_3;
  int b_1;
  int b;
  TValue *io;
  TValue *io1_2;
  TValue *io2_2;
  TValue *rb_1;
  TValue *io1_1;
  TValue *io2_1;
  TValue *rb;
  TValue *io1;
  TValue *io2;
  StkId ra;
  StkId pTStack_30;
  Instruction i;
  StkId base;
  TValue *k;
  LClosure *cl;
  CallInfo *ci;
  lua_State *L_local;
  
  cl = (LClosure *)L->ci;
LAB_0011c5fb:
  pGVar3 = (cl->next->gch).next;
  lVar4 = ((pGVar3->th).l_G)->totalbytes;
  pTStack_30 = *(StkId *)&cl[1].tt;
switchD_0011c6c8_default:
  pGVar15 = cl[1].gclist;
  cl[1].gclist = (GCObject *)((long)&(pGVar15->gch).next + 4);
  ra._4_4_ = *(uint *)pGVar15;
  if (((L->hookmask & 0xc) != 0) &&
     ((iVar8 = L->hookcount + -1, L->hookcount = iVar8, iVar8 == 0 || ((L->hookmask & 4) != 0)))) {
    traceexec(L);
    pTStack_30 = *(StkId *)&cl[1].tt;
  }
  io2 = (TValue *)((long)&pTStack_30->value_ + (ulong)(ra._4_4_ >> 2 & 0xff0));
  switch(ra._4_4_ & 0x3f) {
  case 0:
    io2->value_ = pTStack_30[(int)(ra._4_4_ >> 0x17)].value_;
    io2->tt_ = pTStack_30[(int)(ra._4_4_ >> 0x17)].tt_;
    goto switchD_0011c6c8_default;
  case 1:
    pVVar12 = (Value *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe) * 0x10);
    io2->value_ = *pVVar12;
    io2->tt_ = pVVar12[1].b;
    goto switchD_0011c6c8_default;
  case 2:
    pGVar15 = cl[1].gclist;
    cl[1].gclist = (GCObject *)((long)&(pGVar15->gch).next + 4);
    pVVar12 = (Value *)(lVar4 + (long)(int)(*(uint *)pGVar15 >> 6) * 0x10);
    io2->value_ = *pVVar12;
    io2->tt_ = pVVar12[1].b;
    goto switchD_0011c6c8_default;
  case 3:
    (io2->value_).b = ra._4_4_ >> 0x17;
    io2->tt_ = 1;
    if ((ra._4_4_ >> 0xe & 0x1ff) != 0) {
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
    }
    goto switchD_0011c6c8_default;
  case 4:
    io2_3._4_4_ = ra._4_4_ >> 0x17;
    do {
      io2->tt_ = 0;
      bVar16 = io2_3._4_4_ != 0;
      io2_3._4_4_ = io2_3._4_4_ - 1;
      io2 = io2 + 1;
    } while (bVar16);
    goto switchD_0011c6c8_default;
  case 5:
    pVVar12 = *(Value **)(*(long *)((long)pGVar3 + (long)(int)(ra._4_4_ >> 0x17) * 8 + 0x20) + 0x10)
    ;
    io2->value_ = *pVVar12;
    io2->tt_ = pVVar12[1].b;
    goto switchD_0011c6c8_default;
  case 6:
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_3d0 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_3d0 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    luaV_gettable(L,*(TValue **)
                     (*(long *)((long)pGVar3 + (long)(int)(ra._4_4_ >> 0x17) * 8 + 0x20) + 0x10),
                  local_3d0,io2);
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 7:
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_3e8 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_3e8 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    luaV_gettable(L,pTStack_30 + (int)(ra._4_4_ >> 0x17),local_3e8,io2);
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 8:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_400 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_400 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_410 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_410 = (StkId)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    luaV_settable(L,*(TValue **)
                     (*(long *)((long)pGVar3 + (long)(int)(ra._4_4_ >> 6 & 0xff) * 8 + 0x20) + 0x10)
                  ,local_400,local_410);
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 9:
    pGVar15 = *(GCObject **)((long)pGVar3 + (long)(int)(ra._4_4_ >> 0x17) * 8 + 0x20);
    pTVar14 = (pGVar15->h).array;
    pTVar14->value_ = io2->value_;
    pTVar14->tt_ = io2->tt_;
    if ((((io2->tt_ & 0x40U) != 0) && (((byte)(io2->value_).f[9] & 3) != 0)) &&
       (((pGVar15->gch).marked & 4) != 0)) {
      luaC_barrier_(L,pGVar15,(io2->value_).gc);
    }
    goto switchD_0011c6c8_default;
  case 10:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_428 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_428 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_438 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_438 = (StkId)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    luaV_settable(L,io2,local_428,local_438);
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0xb:
    uVar9 = ra._4_4_ >> 0xe & 0x1ff;
    pGVar15 = (GCObject *)luaH_new(L);
    (io2->value_).gc = pGVar15;
    io2->tt_ = 0x45;
    if ((ra._4_4_ >> 0x17 != 0) || (uVar9 != 0)) {
      iVar8 = luaO_fb2int(ra._4_4_ >> 0x17);
      iVar11 = luaO_fb2int(uVar9);
      luaH_resize(L,&pGVar15->h,iVar8,iVar11);
    }
    if (0 < L->l_G->GCdebt) {
      L->top = io2 + 1;
      luaC_step(L);
      L->top = *(StkId *)&cl->tt;
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0xc:
    pTVar14 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    io2[1].value_ = pTVar14->value_;
    io2[1].tt_ = pTVar14->tt_;
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_468 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_468 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    luaV_gettable(L,pTVar14,local_468,io2);
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0xd:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_470 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_470 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_478 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_478 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_470->tt_ == 3) && (local_478->tt_ == 3)) {
      (io2->value_).n = (local_470->value_).n + (local_478->value_).n;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_470,local_478,TM_ADD);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0xe:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_480 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_480 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_488 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_488 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_480->tt_ == 3) && (local_488->tt_ == 3)) {
      (io2->value_).n = (local_480->value_).n - (local_488->value_).n;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_480,local_488,TM_SUB);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0xf:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_490 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_490 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_498 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_498 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_490->tt_ == 3) && (local_498->tt_ == 3)) {
      (io2->value_).n = (local_490->value_).n * (local_498->value_).n;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_490,local_498,TM_MUL);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0x10:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_4a0 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_4a0 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_4a8 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_4a8 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_4a0->tt_ == 3) && (local_4a8->tt_ == 3)) {
      (io2->value_).n = (local_4a0->value_).n / (local_4a8->value_).n;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_4a0,local_4a8,TM_DIV);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0x11:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_4b0 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_4b0 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_4b8 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_4b8 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_4b0->tt_ == 3) && (local_4b8->tt_ == 3)) {
      dVar18 = (local_4b0->value_).n;
      dVar1 = (local_4b8->value_).n;
      dVar17 = floor(dVar18 / dVar1);
      (io2->value_).n = -dVar17 * dVar1 + dVar18;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_4b0,local_4b8,TM_MOD);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0x12:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_4c8 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_4c8 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_4d0 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_4d0 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    if ((local_4c8->tt_ == 3) && (local_4d0->tt_ == 3)) {
      dVar18 = pow((local_4c8->value_).n,(local_4d0->value_).n);
      (io2->value_).n = dVar18;
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,local_4c8,local_4d0,TM_POW);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0x13:
    pTVar14 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    if (pTVar14->tt_ == 3) {
      (io2->value_).gc = (GCObject *)((ulong)(pTVar14->value_).gc ^ 0x8000000000000000);
      io2->tt_ = 3;
    }
    else {
      luaV_arith(L,io2,pTVar14,pTVar14,TM_UNM);
      pTStack_30 = *(StkId *)&cl[1].tt;
    }
    goto switchD_0011c6c8_default;
  case 0x14:
    pTVar13 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    local_4d1 = true;
    if (pTVar13->tt_ != 0) {
      local_4d2 = false;
      if (pTVar13->tt_ == 1) {
        local_4d2 = (pTVar13->value_).b == 0;
      }
      local_4d1 = local_4d2;
    }
    *(uint *)&io2->value_ = (uint)local_4d1;
    io2->tt_ = 1;
    goto switchD_0011c6c8_default;
  case 0x15:
    luaV_objlen(L,io2,pTStack_30 + (int)(ra._4_4_ >> 0x17));
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x16:
    uVar9 = ra._4_4_ >> 0xe & 0x1ff;
    L->top = pTStack_30 + (long)(int)uVar9 + 1;
    luaV_concat(L,(uVar9 - (ra._4_4_ >> 0x17)) + 1);
    pTVar13 = (StkId)(*(long *)&cl[1].tt + (long)(int)(ra._4_4_ >> 6 & 0xff) * 0x10);
    local_4e0 = (StkId)(*(long *)&cl[1].tt + (long)(int)(ra._4_4_ >> 0x17) * 0x10);
    pTVar13->value_ = local_4e0->value_;
    pTVar13->tt_ = local_4e0->tt_;
    if (0 < L->l_G->GCdebt) {
      if (local_4e0 <= pTVar13) {
        local_4e0 = pTVar13 + 1;
      }
      L->top = local_4e0;
      luaC_step(L);
      L->top = *(StkId *)&cl->tt;
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    L->top = *(StkId *)&cl->tt;
    goto switchD_0011c6c8_default;
  case 0x17:
    uVar9 = ra._4_4_ >> 6 & 0xff;
    if (uVar9 != 0) {
      luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar9 * 0x10 + -0x10));
    }
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((ra._4_4_ >> 0xe) - 0x1ffff) * 4);
    goto switchD_0011c6c8_default;
  case 0x18:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_4e8 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_4e8 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_4f0 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_4f0 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    local_4f1 = false;
    if (local_4e8->tt_ == local_4f0->tt_) {
      iVar8 = luaV_equalobj_(L,local_4e8,local_4f0);
      local_4f1 = iVar8 != 0;
    }
    if ((uint)local_4f1 == (ra._4_4_ >> 6 & 0xff)) {
      uVar9 = *(uint *)cl[1].gclist;
      uVar10 = uVar9 >> 6 & 0xff;
      if (uVar10 != 0) {
        luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar10 * 0x10 + -0x10));
      }
      cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((uVar9 >> 0xe) - 0x1fffe) * 4);
    }
    else {
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x19:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_508 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_508 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_518 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_518 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    uVar9 = luaV_lessthan(L,local_508,local_518);
    if (uVar9 == (ra._4_4_ >> 6 & 0xff)) {
      uVar9 = *(uint *)cl[1].gclist;
      uVar10 = uVar9 >> 6 & 0xff;
      if (uVar10 != 0) {
        luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar10 * 0x10 + -0x10));
      }
      cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((uVar9 >> 0xe) - 0x1fffe) * 4);
    }
    else {
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x1a:
    if ((ra._4_4_ >> 0x17 & 0x100) == 0) {
      local_528 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    }
    else {
      local_528 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0x17 & 0xff) * 0x10);
    }
    if ((ra._4_4_ >> 0xe & 0x100) == 0) {
      local_538 = pTStack_30 + (int)(ra._4_4_ >> 0xe & 0x1ff);
    }
    else {
      local_538 = (TValue *)(lVar4 + (long)(int)(ra._4_4_ >> 0xe & 0xff) * 0x10);
    }
    uVar9 = luaV_lessequal(L,local_528,local_538);
    if (uVar9 == (ra._4_4_ >> 6 & 0xff)) {
      uVar9 = *(uint *)cl[1].gclist;
      uVar10 = uVar9 >> 6 & 0xff;
      if (uVar10 != 0) {
        luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar10 * 0x10 + -0x10));
      }
      cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((uVar9 >> 0xe) - 0x1fffe) * 4);
    }
    else {
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x1b:
    if ((ra._4_4_ >> 0xe & 0x1ff) == 0) {
      if ((io2->tt_ != 0) && ((io2->tt_ != 1 || ((io2->value_).b != 0)))) goto LAB_0011e150;
    }
    else if ((io2->tt_ == 0) || ((io2->tt_ == 1 && ((io2->value_).b == 0)))) {
LAB_0011e150:
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
      goto switchD_0011c6c8_default;
    }
    uVar9 = *(uint *)cl[1].gclist;
    uVar10 = uVar9 >> 6 & 0xff;
    if (uVar10 != 0) {
      luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar10 * 0x10 + -0x10));
    }
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((uVar9 >> 0xe) - 0x1fffe) * 4);
    goto switchD_0011c6c8_default;
  case 0x1c:
    pTVar13 = pTStack_30 + (int)(ra._4_4_ >> 0x17);
    if ((ra._4_4_ >> 0xe & 0x1ff) == 0) {
      if ((pTVar13->tt_ != 0) && ((pTVar13->tt_ != 1 || ((pTVar13->value_).b != 0))))
      goto LAB_0011e25b;
    }
    else if ((pTVar13->tt_ == 0) || ((pTVar13->tt_ == 1 && ((pTVar13->value_).b == 0)))) {
LAB_0011e25b:
      cl[1].gclist = (GCObject *)((long)&((cl[1].gclist)->gch).next + 4);
      goto switchD_0011c6c8_default;
    }
    io2->value_ = pTVar13->value_;
    io2->tt_ = pTVar13->tt_;
    uVar9 = *(uint *)cl[1].gclist;
    uVar10 = uVar9 >> 6 & 0xff;
    if (uVar10 != 0) {
      luaF_close(L,(StkId)(*(long *)&cl[1].tt + (long)(int)uVar10 * 0x10 + -0x10));
    }
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((uVar9 >> 0xe) - 0x1fffe) * 4);
    goto switchD_0011c6c8_default;
  case 0x1d:
    iVar8 = (ra._4_4_ >> 0xe & 0x1ff) - 1;
    if (ra._4_4_ >> 0x17 != 0) {
      L->top = io2 + (int)(ra._4_4_ >> 0x17);
    }
    iVar11 = luaD_precall(L,io2,iVar8);
    if (iVar11 == 0) {
      cl = (LClosure *)L->ci;
      ((CallInfo *)cl)->callstatus = ((CallInfo *)cl)->callstatus | 4;
      goto LAB_0011c5fb;
    }
    if (-1 < iVar8) {
      L->top = *(StkId *)&cl->tt;
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x1e:
    if (ra._4_4_ >> 0x17 != 0) {
      L->top = io2 + (int)(ra._4_4_ >> 0x17);
    }
    iVar8 = luaD_precall(L,io2,-1);
    if (iVar8 != 0) {
      pTStack_30 = *(StkId *)&cl[1].tt;
      goto switchD_0011c6c8_default;
    }
    pCVar5 = L->ci;
    cl = (LClosure *)pCVar5->previous;
    pTVar13 = pCVar5->func;
    pTVar6 = ((CallInfo *)cl)->func;
    pTVar7 = (pCVar5->u).l.base;
    bVar2 = *(byte *)(*(long *)((pTVar13->value_).f + 0x18) + 0x78);
    if (0 < *(int *)&((pGVar3->th).l_G)->allgc) {
      luaF_close(L,(((CallInfo *)cl)->u).l.base);
    }
    for (io2_8._4_4_ = 0; pTVar13 + io2_8._4_4_ < pTVar7 + (int)(uint)bVar2;
        io2_8._4_4_ = io2_8._4_4_ + 1) {
      pTVar6[io2_8._4_4_].value_ = pTVar13[io2_8._4_4_].value_;
      pTVar6[io2_8._4_4_].tt_ = (&pTVar13[io2_8._4_4_].value_)[1].b;
    }
    (((CallInfo *)cl)->u).l.base = pTVar6 + ((long)(pCVar5->u).l.base - (long)pTVar13 >> 4);
    pTVar7 = L->top;
    L->top = pTVar6 + ((long)pTVar7 - (long)pTVar13 >> 4);
    ((CallInfo *)cl)->top = pTVar6 + ((long)pTVar7 - (long)pTVar13 >> 4);
    (((CallInfo *)cl)->u).l.savedpc = (pCVar5->u).l.savedpc;
    ((CallInfo *)cl)->callstatus = ((CallInfo *)cl)->callstatus | 0x40;
    L->ci = (CallInfo *)cl;
    goto LAB_0011c5fb;
  case 0x1f:
    goto switchD_0011c6c8_caseD_1f;
  case 0x20:
    dVar18 = (io2->value_).n + io2[2].value_.n;
    if (io2[2].value_.n <= 0.0) {
      if (dVar18 < io2[1].value_.n) goto switchD_0011c6c8_default;
    }
    else if (io2[1].value_.n < dVar18) goto switchD_0011c6c8_default;
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((ra._4_4_ >> 0xe) - 0x1ffff) * 4);
    (io2->value_).n = dVar18;
    io2->tt_ = 3;
    io2[3].value_.n = dVar18;
    io2[3].tt_ = 3;
    goto switchD_0011c6c8_default;
  case 0x21:
    io_12 = io2 + 2;
    if ((io2->tt_ != 3) && (pTVar14 = luaV_tonumber(io2,io2), pTVar14 == (TValue *)0x0)) {
      luaG_runerror(L,"\'for\' initial value must be a number");
    }
    if ((io2[1].tt_ != 3) && (pTVar14 = luaV_tonumber(io2 + 1,io2 + 1), pTVar14 == (TValue *)0x0)) {
      luaG_runerror(L,"\'for\' limit must be a number");
    }
    if ((io2[2].tt_ != 3) && (io_12 = luaV_tonumber(io_12,io2 + 2), io_12 == (TValue *)0x0)) {
      luaG_runerror(L,"\'for\' step must be a number");
    }
    (io2->value_).n = (io2->value_).n - (io_12->value_).n;
    io2->tt_ = 3;
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((ra._4_4_ >> 0xe) - 0x1ffff) * 4);
    goto switchD_0011c6c8_default;
  case 0x22:
    io2[5].value_ = io2[2].value_;
    io2[5].tt_ = io2[2].tt_;
    io2[4].value_ = io2[1].value_;
    io2[4].tt_ = io2[1].tt_;
    io2[3].value_ = io2->value_;
    io2[3].tt_ = io2->tt_;
    L->top = io2 + 6;
    luaD_call(L,io2 + 3,ra._4_4_ >> 0xe & 0x1ff,1);
    pTStack_30 = *(StkId *)&cl[1].tt;
    L->top = *(StkId *)&cl->tt;
    pGVar15 = cl[1].gclist;
    cl[1].gclist = (GCObject *)((long)&(pGVar15->gch).next + 4);
    ra._4_4_ = *(uint *)pGVar15;
    io2 = pTStack_30 + (int)(ra._4_4_ >> 6 & 0xff);
    break;
  case 0x23:
    break;
  case 0x24:
    last = ra._4_4_ >> 0x17;
    local_360 = ra._4_4_ >> 0xe & 0x1ff;
    if (last == 0) {
      last = (int)((long)L->top - (long)io2 >> 4) + -1;
    }
    if (local_360 == 0) {
      pGVar15 = cl[1].gclist;
      cl[1].gclist = (GCObject *)((long)&(pGVar15->gch).next + 4);
      local_360 = *(uint *)pGVar15 >> 6;
    }
    pGVar15 = (io2->value_).gc;
    h._4_4_ = (local_360 - 1) * 0x32 + last;
    if ((pGVar15->h).sizearray < h._4_4_) {
      luaH_resizearray(L,&pGVar15->h,h._4_4_);
    }
    for (; 0 < last; last = last + -1) {
      pTVar14 = io2 + last;
      luaH_setint(L,&pGVar15->h,h._4_4_,pTVar14);
      if ((((pTVar14->tt_ & 0x40U) != 0) && (((byte)(pTVar14->value_).f[9] & 3) != 0)) &&
         (((pGVar15->gch).marked & 4) != 0)) {
        luaC_barrierback_(L,pGVar15);
      }
      h._4_4_ = h._4_4_ + -1;
    }
    L->top = *(StkId *)&cl->tt;
    goto switchD_0011c6c8_default;
  case 0x25:
    p_00 = *(Proto **)(((pGVar3->th).l_G)->GCmemtrav + (long)(int)(ra._4_4_ >> 0xe) * 8);
    pGVar15 = (GCObject *)getcached(p_00,(UpVal **)&(pGVar3->h).lastfree,pTStack_30);
    if (pGVar15 == (GCObject *)0x0) {
      pushclosure(L,p_00,(UpVal **)&(pGVar3->h).lastfree,pTStack_30,io2);
    }
    else {
      (io2->value_).gc = pGVar15;
      io2->tt_ = 0x46;
    }
    if (0 < L->l_G->GCdebt) {
      L->top = io2 + 1;
      luaC_step(L);
      L->top = *(StkId *)&cl->tt;
    }
    pTStack_30 = *(StkId *)&cl[1].tt;
    goto switchD_0011c6c8_default;
  case 0x26:
    n_1 = (ra._4_4_ >> 0x17) - 1;
    iVar8 = ((int)((long)pTStack_30 - (long)cl->next >> 4) -
            (uint)*(byte *)&((pGVar3->th).l_G)->sweepfin) + -1;
    if (n_1 < 0) {
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)iVar8) {
        luaD_growstack(L,iVar8);
      }
      pTStack_30 = *(StkId *)&cl[1].tt;
      io2 = pTStack_30 + (int)(ra._4_4_ >> 6 & 0xff);
      L->top = io2 + iVar8;
      n_1 = iVar8;
    }
    for (local_398 = 0; local_398 < n_1; local_398 = local_398 + 1) {
      if (local_398 < iVar8) {
        io2[local_398].value_ = pTStack_30[(long)local_398 - (long)iVar8].value_;
        io2[local_398].tt_ = pTStack_30[(long)local_398 - (long)iVar8].tt_;
      }
      else {
        io2[local_398].tt_ = 0;
      }
    }
    goto switchD_0011c6c8_default;
  case 0x27:
  default:
    goto switchD_0011c6c8_default;
  }
  if (io2[1].tt_ != 0) {
    io2->value_ = io2[1].value_;
    io2->tt_ = io2[1].tt_;
    cl[1].gclist = (GCObject *)((long)cl[1].gclist + (long)(int)((ra._4_4_ >> 0xe) - 0x1ffff) * 4);
  }
  goto switchD_0011c6c8_default;
switchD_0011c6c8_caseD_1f:
  if (ra._4_4_ >> 0x17 != 0) {
    L->top = io2 + (long)(int)(ra._4_4_ >> 0x17) + -1;
  }
  if (0 < *(int *)&((pGVar3->th).l_G)->allgc) {
    luaF_close(L,pTStack_30);
  }
  iVar8 = luaD_poscall(L,io2);
  if (((ulong)cl->upvals[0] & 0x40000) == 0) {
    return;
  }
  cl = (LClosure *)L->ci;
  if (iVar8 != 0) {
    L->top = ((CallInfo *)cl)->top;
  }
  goto LAB_0011c5fb;
}

Assistant:

void luaV_execute (lua_State *L) {
  CallInfo *ci = L->ci;
  LClosure *cl;
  TValue *k;
  StkId base;
 newframe:  /* reentry point when frame changes (call/return) */
  lua_assert(ci == L->ci);
  cl = clLvalue(ci->func);
  k = cl->p->k;
  base = ci->u.l.base;
  /* main loop of interpreter */
  for (;;) {
    Instruction i = *(ci->u.l.savedpc++);
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      Protect(traceexec(L));
    }
    /* WARNING: several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == ci->u.l.base);
    lua_assert(base <= L->top && L->top < L->stack + L->stacksize);
    vmdispatch (GET_OPCODE(i)) {
      vmcase(OP_MOVE,
        setobjs2s(L, ra, RB(i));
      )
      vmcase(OP_LOADK,
        TValue *rb = k + GETARG_Bx(i);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADKX,
        TValue *rb;
        lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
        rb = k + GETARG_Ax(*ci->u.l.savedpc++);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADBOOL,
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) ci->u.l.savedpc++;  /* skip next instruction (if C) */
      )
      vmcase(OP_LOADNIL,
        int b = GETARG_B(i);
        do {
          setnilvalue(ra++);
        } while (b--);
      )
      vmcase(OP_GETUPVAL,
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
      )
      vmcase(OP_GETTABUP,
        int b = GETARG_B(i);
        Protect(luaV_gettable(L, cl->upvals[b]->v, RKC(i), ra));
      )
      vmcase(OP_GETTABLE,
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
      )
      vmcase(OP_SETTABUP,
        int a = GETARG_A(i);
        Protect(luaV_settable(L, cl->upvals[a]->v, RKB(i), RKC(i)));
      )
      vmcase(OP_SETUPVAL,
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
      )
      vmcase(OP_SETTABLE,
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
      )
      vmcase(OP_NEWTABLE,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Table *t = luaH_new(L);
        sethvalue(L, ra, t);
        if (b != 0 || c != 0)
          luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
        checkGC(L, ra + 1);
      )
      vmcase(OP_SELF,
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
      )
      vmcase(OP_ADD,
        arith_op(luai_numadd, TM_ADD);
      )
      vmcase(OP_SUB,
        arith_op(luai_numsub, TM_SUB);
      )
      vmcase(OP_MUL,
        arith_op(luai_nummul, TM_MUL);
      )
      vmcase(OP_DIV,
        arith_op(luai_numdiv, TM_DIV);
      )
      vmcase(OP_MOD,
        arith_op(luai_nummod, TM_MOD);
      )
      vmcase(OP_POW,
        arith_op(luai_numpow, TM_POW);
      )
      vmcase(OP_UNM,
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(L, nb));
        }
        else {
          Protect(luaV_arith(L, ra, rb, rb, TM_UNM));
        }
      )
      vmcase(OP_NOT,
        TValue *rb = RB(i);
        int res = l_isfalse(rb);  /* next assignment may change this value */
        setbvalue(ra, res);
      )
      vmcase(OP_LEN,
        Protect(luaV_objlen(L, ra, RB(i)));
      )
      vmcase(OP_CONCAT,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        StkId rb;
        L->top = base + c + 1;  /* mark the end of concat operands */
        Protect(luaV_concat(L, c - b + 1));
        ra = RA(i);  /* 'luav_concat' may invoke TMs and move the stack */
        rb = b + base;
        setobjs2s(L, ra, rb);
        checkGC(L, (ra >= rb ? ra + 1 : rb));
        L->top = ci->top;  /* restore top */
      )
      vmcase(OP_JMP,
        dojump(ci, i, 0);
      )
      vmcase(OP_EQ,
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (cast_int(equalobj(L, rb, rc)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LT,
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LE,
        Protect(
          if (luaV_lessequal(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_TEST,
        if (GETARG_C(i) ? l_isfalse(ra) : !l_isfalse(ra))
            ci->u.l.savedpc++;
          else
          donextjump(ci);
      )
      vmcase(OP_TESTSET,
        TValue *rb = RB(i);
        if (GETARG_C(i) ? l_isfalse(rb) : !l_isfalse(rb))
          ci->u.l.savedpc++;
        else {
          setobjs2s(L, ra, rb);
          donextjump(ci);
        }
      )
      vmcase(OP_CALL,
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        if (luaD_precall(L, ra, nresults)) {  /* C function? */
          if (nresults >= 0) L->top = ci->top;  /* adjust results */
          base = ci->u.l.base;
        }
        else {  /* Lua function */
          ci = L->ci;
          ci->callstatus |= CIST_REENTRY;
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_TAILCALL,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        if (luaD_precall(L, ra, LUA_MULTRET))  /* C function? */
          base = ci->u.l.base;
        else {
          /* tail call: put called frame (n) in place of caller one (o) */
          CallInfo *nci = L->ci;  /* called frame */
          CallInfo *oci = nci->previous;  /* caller frame */
          StkId nfunc = nci->func;  /* called function */
          StkId ofunc = oci->func;  /* caller function */
          /* last stack slot filled by 'precall' */
          StkId lim = nci->u.l.base + getproto(nfunc)->numparams;
          int aux;
          /* close all upvalues from previous call */
          if (cl->p->sizep > 0) luaF_close(L, oci->u.l.base);
          /* move new frame into old one */
          for (aux = 0; nfunc + aux < lim; aux++)
            setobjs2s(L, ofunc + aux, nfunc + aux);
          oci->u.l.base = ofunc + (nci->u.l.base - nfunc);  /* correct base */
          oci->top = L->top = ofunc + (L->top - nfunc);  /* correct top */
          oci->u.l.savedpc = nci->u.l.savedpc;
          oci->callstatus |= CIST_TAIL;  /* function was tail called */
          ci = L->ci = oci;  /* remove new frame */
          lua_assert(L->top == oci->u.l.base + getproto(ofunc)->maxstacksize);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcasenb(OP_RETURN,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (cl->p->sizep > 0) luaF_close(L, base);
        b = luaD_poscall(L, ra);
        if (!(ci->callstatus & CIST_REENTRY))  /* 'ci' still the called one */
          return;  /* external invocation: return */
        else {  /* invocation via reentry: continue execution */
          ci = L->ci;
          if (b) L->top = ci->top;
          lua_assert(isLua(ci));
          lua_assert(GET_OPCODE(*((ci)->u.l.savedpc - 1)) == OP_CALL);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_FORLOOP,
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(L, nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(L, 0, step) ? luai_numle(L, idx, limit)
                                   : luai_numle(L, limit, idx)) {
          ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
      )
      vmcase(OP_FORPREP,
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(L, nvalue(ra), nvalue(pstep)));
        ci->u.l.savedpc += GETARG_sBx(i);
      )
      vmcasenb(OP_TFORCALL,
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb + 3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i), 1));
        L->top = ci->top;
        i = *(ci->u.l.savedpc++);  /* go to next instruction */
        ra = RA(i);
        lua_assert(GET_OPCODE(i) == OP_TFORLOOP);
        goto l_tforloop;
      )
      vmcase(OP_TFORLOOP,
        l_tforloop:
        if (!ttisnil(ra + 1)) {  /* continue loop? */
          setobjs2s(L, ra, ra + 1);  /* save control variable */
           ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
        }
      )
      vmcase(OP_SETLIST,
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) n = cast_int(L->top - ra) - 1;
        if (c == 0) {
          lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
          c = GETARG_Ax(*ci->u.l.savedpc++);
        }
        luai_runtimecheck(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-allocate it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          luaH_setint(L, h, last--, val);
          luaC_barrierback(L, obj2gco(h), val);
        }
        L->top = ci->top;  /* correct top (in case of previous open call) */
      )
      vmcase(OP_CLOSURE,
        Proto *p = cl->p->p[GETARG_Bx(i)];
        Closure *ncl = getcached(p, cl->upvals, base);  /* cached closure */
        if (ncl == NULL)  /* no match? */
          pushclosure(L, p, cl->upvals, base, ra);  /* create a new one */
        else
          setclLvalue(L, ra, ncl);  /* push cashed closure */
        checkGC(L, ra + 1);
      )
      vmcase(OP_VARARG,
        int b = GETARG_B(i) - 1;
        int j;
        int n = cast_int(base - ci->func) - cl->p->numparams - 1;
        if (b < 0) {  /* B == 0? */
          b = n;  /* get all var. arguments */
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
      )
      vmcase(OP_EXTRAARG,
        lua_assert(0);
      )
    }
  }
}